

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cc
# Opt level: O2

void __thiscall Message::~Message(Message *this)

{
  this->_vptr_Message = (_func_int **)&PTR__Message_0010bb28;
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

virtual ~Message() = default;